

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3.c
# Opt level: O1

void Fatal(unqlite *pDb,char *zMsg)

{
  char *zErr;
  int iLen;
  char *local_18;
  int local_c;
  
  if (pDb == (unqlite *)0x0) {
    local_18 = zMsg;
    if (zMsg == (char *)0x0) goto LAB_0010a6fa;
  }
  else {
    local_c = 0;
    unqlite_config(pDb,3,&local_18,&local_c);
    if (local_c < 1) goto LAB_0010a6fa;
  }
  puts(local_18);
LAB_0010a6fa:
  unqlite_lib_shutdown();
  exit(0);
}

Assistant:

static void Fatal(unqlite *pDb,const char *zMsg)
{
	if( pDb ){
		const char *zErr;
		int iLen = 0; /* Stupid cc warning */

		/* Extract the database error log */
		unqlite_config(pDb,UNQLITE_CONFIG_ERR_LOG,&zErr,&iLen);
		if( iLen > 0 ){
			/* Output the DB error log */
			puts(zErr); /* Always null terminated */
		}
	}else{
		if( zMsg ){
			puts(zMsg);
		}
	}
	/* Manually shutdown the library */
	unqlite_lib_shutdown();
	/* Exit immediately */
	exit(0);
}